

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O2

int demo_color_proc(DEMO_MENU *item,int msg,int extra)

{
  uint uVar1;
  ALLEGRO_FONT *font;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  float fVar14;
  undefined4 uVar15;
  float in_XMM1_Da;
  float fVar16;
  float fVar17;
  float fVar18;
  int rgb [3];
  
  iVar11 = screen_width / 0x12;
  iVar6 = 1000;
  switch(msg + -1) {
  case 0:
    uVar12 = al_map_rgb(0xff,0xff,(((uint)item->flags >> 1 & 1) != 0) + -1);
    fVar16 = in_XMM1_Da;
    uVar13 = al_map_rgb(0xff,0xff,0xff);
    iVar5 = screen_width / 2;
    iVar6 = (iVar11 * 3) / -2;
    iVar4 = al_get_font_line_height(demo_data[1].dat);
    fVar17 = in_XMM1_Da;
    shadow_textprintf((ALLEGRO_FONT *)demo_data[1].dat,iVar5 + -8 + iVar6,extra,1,(int)item->name,
                      uVar12);
    uVar1 = *(uint *)item->data;
    rgb[0] = uVar1 & 0xff;
    uVar7 = uVar1 >> 8 & 0xff;
    rgb[1] = uVar7;
    uVar8 = uVar1 >> 0x10 & 0xff;
    fVar14 = (float)(extra + 5);
    rgb[2] = uVar8;
    iVar6 = iVar5 + iVar6 + 8;
    for (uVar9 = 0; uVar9 != 3; uVar9 = uVar9 + 1) {
      iVar5 = (rgb[uVar9] * (iVar11 + -0xc)) / 0xff;
      uVar15 = al_map_rgb(0,0,0);
      fVar18 = fVar14;
      al_draw_rectangle((float)(iVar6 + -6),fVar14,(float)(iVar11 + iVar6 + -10),
                        (float)(iVar4 + extra + -1),uVar15,fVar17,0x3f800000);
      uVar15 = al_map_rgb(0,0,0);
      al_draw_filled_rectangle
                ((float)(iVar6 + iVar5 + -5),(float)(extra + 6),(float)(iVar6 + iVar5 + -1),
                 (float)(iVar4 + -4 + extra),uVar15,fVar18);
      uVar15 = uVar12;
      fVar17 = in_XMM1_Da;
      if (uVar9 != (uint)item->extra) {
        uVar15 = uVar13;
        fVar17 = fVar16;
      }
      al_draw_rectangle((float)(iVar6 + -8),(float)(extra + 3),(float)(iVar11 + iVar6 + -0xc),
                        (float)(iVar4 + -3 + extra),uVar15,fVar17,0x3f800000);
      uVar15 = uVar12;
      fVar18 = in_XMM1_Da;
      if (uVar9 != (uint)item->extra) {
        uVar15 = uVar13;
        fVar18 = fVar16;
      }
      fVar17 = fVar14;
      al_draw_filled_rectangle
                ((float)(iVar6 + iVar5 + -6),fVar14,(float)(iVar6 + -2 + iVar5),
                 (float)(iVar4 + -5 + extra),uVar15,fVar18);
      iVar6 = iVar6 + iVar11;
    }
    snprintf(demo_color_proc::buf,0x40,"%d,%d,%d",(ulong)(uVar1 & 0xff),(ulong)uVar7,(ulong)uVar8);
    font = (ALLEGRO_FONT *)demo_data[1].dat;
    uVar12 = al_map_rgb(uVar1 & 0xff,uVar1 >> 8 & 0xff,uVar1 >> 0x10 & 0xff);
    shadow_textprintf(font,iVar6,extra,0,0x11a810,uVar12,fVar17);
    iVar6 = 1000;
    break;
  case 2:
    uVar1 = *(uint *)item->data;
    rgb[0] = uVar1 & 0xff;
    rgb[1] = uVar1 >> 8 & 0xff;
    rgb[2] = uVar1 >> 0x10 & 0xff;
    _Var3 = key_pressed(0x52);
    bVar2 = false;
    if ((_Var3) && (0 < rgb[item->extra])) {
      _Var3 = key_down(0xd7);
      if ((_Var3) || (_Var3 = key_down(0xd8), _Var3)) {
        rgb[item->extra] = rgb[item->extra] + -1;
      }
      else {
        iVar11 = 0x10;
        if (0x10 < rgb[item->extra]) {
          iVar11 = rgb[item->extra];
        }
        rgb[item->extra] = iVar11 + -0x10;
      }
      bVar2 = true;
    }
    _Var3 = key_pressed(0x53);
    if ((_Var3) && (rgb[item->extra] < 0xff)) {
      bVar2 = true;
      _Var3 = key_down(0xd7);
      if ((_Var3) || (_Var3 = key_down(0xd8), _Var3)) {
        rgb[item->extra] = rgb[item->extra] + 1;
      }
      else {
        iVar11 = 0xef;
        if (rgb[item->extra] < 0xef) {
          iVar11 = rgb[item->extra];
        }
        rgb[item->extra] = iVar11 + 0x10;
      }
    }
    _Var3 = key_pressed(0x40);
    if (_Var3) {
      _Var3 = key_down(0xd7);
      if ((_Var3) || (_Var3 = key_down(0xd8), _Var3)) {
        iVar11 = item->extra;
        item->extra = iVar11 + -1;
        if (iVar11 < 1) {
          item->extra = iVar11 + 2;
        }
      }
      else {
        item->extra = (item->extra + 1) % 3;
      }
      play_sound_id(7,0xff,0x80,-100,0);
      if (item->on_activate != (_func_void_DEMO_MENU_ptr *)0x0) {
        (*item->on_activate)(item);
      }
    }
    if (bVar2) {
      *(int *)item->data = rgb[2] * 0x10000 + rgb[1] * 0x100 + rgb[0];
      play_sound_id(7,0xff,0x80,-100,0);
      if (item->on_activate != (_func_void_DEMO_MENU_ptr *)0x0) {
        (*item->on_activate)(item);
      }
    }
    break;
  case 3:
    iVar6 = al_get_text_width(demo_data[1].dat,item->name);
    iVar5 = al_get_text_width(demo_data[1].dat,"255,255,255");
    if (iVar11 * 3 + iVar5 * 2 + 0x10 < iVar11 * 3 + 0x10 + iVar6 * 2) {
      pcVar10 = item->name;
    }
    else {
      pcVar10 = "255,255,255";
    }
    iVar6 = al_get_text_width(demo_data[1].dat,pcVar10);
    iVar6 = iVar11 * 3 + 0x10 + iVar6 * 2;
    break;
  case 4:
    iVar6 = al_get_font_line_height
                      (demo_data[1].dat,msg + -1,(long)screen_width % 0x12 & 0xffffffff);
    return iVar6;
  }
  return iVar6;
}

Assistant:

int demo_color_proc(DEMO_MENU * item, int msg, int extra)
{
   int x, h, cw, cx, i, c;
   ALLEGRO_COLOR col1, col2;
   int rgb[3];
   static char buf[64];
   int changed = 0;
   int slider_width = screen_width / 6;

   slider_width /= 3;
   slider_width -= 4;

   if (msg == DEMO_MENU_MSG_DRAW) {
      if (item->flags & DEMO_MENU_SELECTED) {
         col1 = al_map_rgb(255, 255, 0);
         col2 = al_map_rgb(255, 255, 255);
      } else {
         col1 = al_map_rgb(255, 255, 255);
         col2 = al_map_rgb(255, 255, 255);
      }

      x = screen_width / 2 - (slider_width + 4) * 3 / 2;
      h = al_get_font_line_height(demo_font);

      shadow_textprintf(demo_font, x - 8, extra, col1,
                      1, item->name);

      c = *(int *)(item->data);
      rgb[0] = c & 255;
      rgb[1] = (c >> 8) & 255;
      rgb[2] = (c >> 16) & 255;

      for (i = 0; i < 3; i++) {
         cw = 4;
         cx = (slider_width - 4 - cw) * rgb[i] / 255;

         al_draw_rectangle(x + 2, extra + 5,
              x + slider_width + 2, extra + h - 1, al_map_rgb(0, 0, 0), 1);
         al_draw_filled_rectangle(x + 3 + cx, extra + 6,
                  x + 3 + cx + cw, extra + h - 4, al_map_rgb(0, 0, 0));

         al_draw_rectangle(x, extra + 3, x + slider_width,
              extra + h - 3, item->extra == i ? col1 : col2, 1);
         al_draw_filled_rectangle(x + 2 + cx, extra + 5,
                  x + 2 + cx + cw, extra + h - 5,
                  item->extra == i ? col1 : col2);

         x += slider_width + 4;
      }

      snprintf(buf, sizeof(buf), "%d,%d,%d", rgb[0], rgb[1], rgb[2]);
      shadow_textprintf(demo_font, x + 8, extra, al_map_rgb(rgb[0], rgb[1], rgb[2]), 0, buf);
   } else if (msg == DEMO_MENU_MSG_KEY) {
      c = *(int *)(item->data);

      rgb[0] = (c >> 0) & 255;
      rgb[1] = (c >> 8) & 255;
      rgb[2] = (c >> 16) & 255;
   
   

     if (key_pressed(ALLEGRO_KEY_LEFT)) {
         if (rgb[item->extra] > 0) {
            if (key_down(ALLEGRO_KEY_LSHIFT) || key_down(ALLEGRO_KEY_RSHIFT)) {
               --rgb[item->extra];
            } else {
               rgb[item->extra] -= 16;
               rgb[item->extra] = MAX(0, rgb[item->extra]);
            }

            changed = 1;
         }
      }

      if (key_pressed(ALLEGRO_KEY_RIGHT)) {
         if (rgb[item->extra] < 255) {
            if (key_down(ALLEGRO_KEY_LSHIFT) || key_down(ALLEGRO_KEY_RSHIFT)) {
               ++rgb[item->extra];
            } else {
               rgb[item->extra] += 16;
               rgb[item->extra] = MIN(255, rgb[item->extra]);
            }

            changed = 1;
         }
      }

      if (key_pressed(ALLEGRO_KEY_TAB)) {
         if (key_down(ALLEGRO_KEY_LSHIFT) || key_down(ALLEGRO_KEY_RSHIFT)) {
            --item->extra;
            if (item->extra < 0) {
               item->extra += 3;
            }
         } else {
            ++item->extra;
            item->extra %= 3;
         }
         play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
         if (item->on_activate) {
            item->on_activate(item);
         }
      }

      if (changed) {
         *(int *)(item->data) = rgb[0] + (rgb[1] << 8) + (rgb[2] << 16);

         play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);

         if (item->on_activate) {
            item->on_activate(item);
         }
      }
   } else if (msg == DEMO_MENU_MSG_WIDTH) {
      return MAX(al_get_text_width(demo_font, item->name) * 2 + 8 * 2 +
                 3 * (slider_width + 4),
                 8 * 2 + 3 * (slider_width + 4) +
                 2 * al_get_text_width(demo_font, "255,255,255"));
   } else if (msg == DEMO_MENU_MSG_HEIGHT) {
      return al_get_font_line_height(demo_font);
   }

   return DEMO_MENU_CONTINUE;
}